

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Simplex_tree.h
# Opt level: O2

void Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>::intersection<false>
               (vector<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>,_std::allocator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_>_>
                *intersection,Dictionary_const_it *begin1,Dictionary_const_it *end1,
               Dictionary_const_it *begin2,Dictionary_const_it *end2,Filtration_value *filtration_)

{
  double dVar1;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *ppVar2;
  vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
  *pvVar3;
  pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>
  *__args;
  Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_48;
  
  __args = begin1->m_ptr;
  if ((__args == end1->m_ptr) || (ppVar2 = begin2->m_ptr, ppVar2 == end2->m_ptr)) {
    return;
  }
  do {
    if (__args->first == ppVar2->first) {
      local_48.super_Filtration_simplex_base.filt_ =
           (__args->second).super_Filtration_simplex_base.filt_;
      dVar1 = (ppVar2->second).super_Filtration_simplex_base.filt_;
      if (local_48.super_Filtration_simplex_base.filt_ < dVar1) {
        local_48.super_Filtration_simplex_base.filt_ = dVar1;
      }
      if (local_48.super_Filtration_simplex_base.filt_ < *filtration_) {
        local_48.super_Filtration_simplex_base.filt_ = *filtration_;
      }
      local_48.super_Key_simplex_base.key_ = 0xffffffff;
      local_48.children_ = (Siblings *)0x0;
      std::
      vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
      ::
      emplace_back<int_const&,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>
                ((vector<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>,std::allocator<std::pair<int,Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>>>>
                  *)intersection,&__args->first,&local_48);
      pvVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator++(begin1);
      if (pvVar3->m_ptr == end1->m_ptr) {
        return;
      }
LAB_00164d8f:
      pvVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator++(begin2);
      if (pvVar3->m_ptr == end2->m_ptr) {
        return;
      }
    }
    else {
      if (ppVar2->first <= __args->first) goto LAB_00164d8f;
      pvVar3 = boost::container::
               vec_iterator<std::pair<int,_Gudhi::Simplex_tree_node_explicit_storage<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>_>_*,_true>
               ::operator++(begin1);
      if (pvVar3->m_ptr == end1->m_ptr) {
        return;
      }
    }
    __args = begin1->m_ptr;
    ppVar2 = begin2->m_ptr;
  } while( true );
}

Assistant:

static void intersection(std::vector<std::pair<Vertex_handle, Node> >& intersection,
                           Dictionary_const_it begin1, Dictionary_const_it end1,
                           Dictionary_const_it begin2, Dictionary_const_it end2,
                           const Filtration_value& filtration_) {
    if (begin1 == end1 || begin2 == end2)
      return;  // ----->>
    while (true) {
      if (begin1->first == begin2->first) {
        if constexpr (force_filtration_value){
          intersection.emplace_back(begin1->first, Node(nullptr, filtration_));
        } else {
          Filtration_value filt = begin1->second.filtration();
          intersect_lifetimes(filt, begin2->second.filtration());
          intersect_lifetimes(filt, filtration_);
          intersection.emplace_back(begin1->first, Node(nullptr, filt));
        }
        if (++begin1 == end1 || ++begin2 == end2)
          return;  // ----->>
      } else if (begin1->first < begin2->first) {
        if (++begin1 == end1)
          return;
      } else /* begin1->first > begin2->first */ {
        if (++begin2 == end2)
          return;  // ----->>
      }
    }
  }